

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O0

ON_ArchivableDictionaryPrivate * __thiscall
ON_ArchivableDictionaryPrivate::operator=
          (ON_ArchivableDictionaryPrivate *this,ON_ArchivableDictionaryPrivate *other)

{
  bool bVar1;
  int iVar2;
  reference __k;
  mapped_type *this_00;
  pointer pDVar3;
  undefined4 extraout_var;
  unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *value;
  ON_wString *key;
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>
  *item;
  const_iterator __end1;
  const_iterator __begin1;
  map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
  *__range1;
  ON_ArchivableDictionaryPrivate *other_local;
  ON_ArchivableDictionaryPrivate *this_local;
  
  this->m_version = other->m_version;
  ON_wString::operator=(&this->m_name,&other->m_name);
  std::
  map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
  ::clear(&this->m_map);
  __end1 = std::
           map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
           ::begin(&other->m_map);
  item = (pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>
          *)std::
            map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
            ::end(&other->m_map);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&item);
    if (!bVar1) break;
    __k = std::
          _Rb_tree_const_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
          ::operator*(&__end1);
    this_00 = std::
              map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
              ::operator[](&this->m_map,&__k->first);
    pDVar3 = std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>::operator->
                       (&__k->second);
    iVar2 = (*pDVar3->_vptr_DictionaryEntry[3])();
    std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>::reset
              (this_00,(pointer)CONCAT44(extraout_var,iVar2));
    std::
    _Rb_tree_const_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
    ::operator++(&__end1);
  }
  return this;
}

Assistant:

ON_ArchivableDictionaryPrivate& operator=(const ON_ArchivableDictionaryPrivate& other)
  {
    m_version = other.m_version;
    m_name = other.m_name;

    m_map.clear();
    for (const auto & item : other.m_map)
    {
      const auto& key = item.first;
      const auto& value = item.second;
      m_map[key].reset(value->Duplicate());
    }

    return *this;
  }